

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjDumpParser.cpp
# Opt level: O3

bool __thiscall ObjDumpParser::parseFunctionCall(ObjDumpParser *this,char **data,size_t size)

{
  char *__nptr;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  char *begin;
  char *begin_1;
  char *pcVar5;
  int iVar6;
  long lVar7;
  
  __nptr = *data;
  uVar3 = strtoul(__nptr,data,0x10);
  if (((uVar3 != 0) && (pcVar5 = *data, *pcVar5 == ':')) && (pcVar5[1] == '\t')) {
    pcVar5 = pcVar5 + 2;
    *data = pcVar5;
    iVar6 = 0;
    do {
      iVar4 = (int)*pcVar5;
      iVar2 = isxdigit(iVar4);
      if (((iVar2 == 0) || (iVar2 = isxdigit((int)pcVar5[1]), iVar2 == 0)) ||
         (iVar2 = isspace((int)pcVar5[2]), iVar2 == 0)) {
        if (iVar6 == 0) {
          return false;
        }
        goto LAB_00118ea9;
      }
      pcVar5 = pcVar5 + 3;
      *data = pcVar5;
      iVar6 = iVar6 + -1;
    } while (iVar6 != -7);
    iVar4 = (int)*pcVar5;
LAB_00118ea9:
    iVar6 = isspace(iVar4);
    while (iVar6 != 0) {
      pcVar5 = pcVar5 + 1;
      *data = pcVar5;
      iVar6 = isspace((int)*pcVar5);
    }
    lVar7 = 7;
    iVar6 = strncmp(pcVar5,"callq  ",7);
    if (iVar6 != 0) {
      lVar7 = 6;
      iVar6 = strncmp(pcVar5,"call  ",6);
      if (iVar6 != 0) {
        return false;
      }
    }
    *data = pcVar5 + lVar7;
    uVar3 = strtoul(pcVar5 + lVar7,data,0x10);
    if (((uVar3 != 0) && (pcVar5 = *data, *pcVar5 == ' ')) &&
       ((pcVar5[1] == '<' && (*data = pcVar5 + 2, __nptr[size - 1] == '>')))) {
      bVar1 = ScParser::parseFunctionCall(this->m_scParser,data);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ObjDumpParser::parseFunctionCall(char *&data, std::size_t size)
{
    const char *const endOfData = data + size - 1;

    if (!(expectAddress(data) && expectString(data, ":\t") && expectAsmBytes(data)
          && (expectString(data, "callq  ") || expectString(data, "call  ")) && expectAddress(data)
          && expectString(data, " <"))) {
        return false;
    }

    if (!eqString(endOfData, ">")) {
        return false;
    }

    return m_scParser.parseFunctionCall(data);
}